

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_field.cc
# Opt level: O0

vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_> *
google::protobuf::compiler::cpp::anon_unknown_3::Vars
          (vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
           *__return_storage_ptr__,FieldDescriptor *field,Options *opts)

{
  initializer_list<google::protobuf::io::Printer::Sub> __l;
  Type TVar1;
  Descriptor *this;
  Options *options;
  AlphaNum *field_00;
  FieldDescriptor *field_01;
  FieldDescriptor *field_02;
  FieldDescriptor *field_03;
  string_view pc;
  Sub *local_eb8;
  char (*local_e98) [5];
  allocator<google::protobuf::io::Printer::Sub> local_da2;
  undefined1 local_da1;
  char *local_da0;
  allocator<char> local_d91;
  string local_d90;
  allocator<char> local_d69;
  string local_d68;
  allocator<char> local_d41;
  string local_d40;
  byte local_d1a;
  allocator<char> local_d19;
  AlphaNum local_d18;
  AlphaNum local_ce8;
  undefined1 local_cb8 [72];
  Sub local_c70;
  allocator<char> local_bb1;
  string local_bb0;
  AlphaNum local_b90;
  AlphaNum local_b60;
  byte local_b2a;
  allocator<char> local_b29;
  undefined1 local_b28 [72];
  AlphaNum local_ae0;
  AlphaNum local_ab0;
  undefined1 local_a80 [72];
  string local_a38;
  allocator<char> local_a11;
  string local_a10;
  string local_9f0;
  allocator<char> local_9c9;
  string local_9c8;
  unsigned_long local_9a8;
  allocator<char> local_999;
  string local_998;
  string local_978;
  allocator<char> local_951;
  string local_950;
  Sub *local_930;
  Sub local_928;
  Sub local_870;
  Sub local_7b8;
  Sub local_700;
  Sub local_648;
  Sub local_590;
  Sub local_4d8;
  Sub local_420;
  Sub local_368;
  Sub local_2b0;
  iterator local_1f8;
  size_type local_1f0;
  undefined1 local_1e2;
  undefined1 local_1e1;
  undefined1 local_1e0 [6];
  bool bytes;
  bool empty_default;
  AlphaNum local_1c0;
  AlphaNum local_190;
  string local_150;
  AlphaNum local_130;
  undefined1 local_100 [8];
  string lazy_var;
  AlphaNum local_70;
  undefined1 local_40 [8];
  string trivial_default;
  Options *opts_local;
  FieldDescriptor *field_local;
  
  trivial_default.field_2._8_8_ = opts;
  absl::lts_20240722::AlphaNum::AlphaNum(&local_70,"::");
  pc = ProtobufNamespace((Options *)trivial_default.field_2._8_8_);
  absl::lts_20240722::AlphaNum::AlphaNum((AlphaNum *)&stack0xffffffffffffff60,pc);
  options = (Options *)((long)&lazy_var.field_2 + 8);
  absl::lts_20240722::AlphaNum::AlphaNum
            ((AlphaNum *)options,"::internal::GetEmptyStringAlreadyInited()");
  absl::lts_20240722::StrCat_abi_cxx11_
            ((AlphaNum *)local_40,&local_70,(AlphaNum *)&stack0xffffffffffffff60);
  this = FieldDescriptor::containing_type(field);
  QualifiedClassName_abi_cxx11_
            (&local_150,(cpp *)this,(Descriptor *)trivial_default.field_2._8_8_,options);
  absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>(&local_130,&local_150);
  absl::lts_20240722::AlphaNum::AlphaNum(&local_190,"::");
  MakeDefaultFieldName_abi_cxx11_((string *)local_1e0,(cpp *)field,field_01);
  absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>
            (&local_1c0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0);
  field_00 = &local_1c0;
  absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_100,&local_130,&local_190);
  std::__cxx11::string::~string((string *)local_1e0);
  std::__cxx11::string::~string((string *)&local_150);
  FieldDescriptor::default_value_string_abi_cxx11_(field);
  local_1e1 = std::__cxx11::string::empty();
  TVar1 = FieldDescriptor::type(field);
  local_1e2 = TVar1 == TYPE_BYTES;
  local_da1 = 1;
  local_930 = &local_928;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_950,"kDefault",&local_951);
  DefaultValue_abi_cxx11_
            (&local_978,(cpp *)trivial_default.field_2._8_8_,(Options *)field,
             (FieldDescriptor *)field_00);
  io::Printer::Sub::Sub<std::__cxx11::string>(&local_928,&local_950,&local_978);
  local_930 = &local_870;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_998,"kDefaultLen",&local_999);
  FieldDescriptor::default_value_string_abi_cxx11_(field);
  local_9a8 = std::__cxx11::string::size();
  io::Printer::Sub::Sub<unsigned_long>(&local_870,&local_998,&local_9a8);
  local_930 = &local_7b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9c8,"default_variable_name",&local_9c9);
  MakeDefaultName_abi_cxx11_(&local_9f0,(cpp *)field,field_02);
  io::Printer::Sub::Sub<std::__cxx11::string>(&local_7b8,&local_9c8,&local_9f0);
  local_930 = &local_700;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a10,"default_variable_field",&local_a11);
  MakeDefaultFieldName_abi_cxx11_(&local_a38,(cpp *)field,field_03);
  io::Printer::Sub::Sub<std::__cxx11::string>(&local_700,&local_a10,&local_a38);
  local_930 = &local_648;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_a80 + 0x28),"kDefaultStr",(allocator<char> *)(local_a80 + 0x27));
  if ((local_1e1 & 1) == 0) {
    absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>
              (&local_ab0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100);
    absl::lts_20240722::AlphaNum::AlphaNum(&local_ae0,".get()");
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_a80,&local_ab0);
  }
  else {
    std::__cxx11::string::string((string *)local_a80,(string *)local_40);
  }
  io::Printer::Sub::Sub<std::__cxx11::string>
            (&local_648,(string *)(local_a80 + 0x28),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a80);
  local_930 = &local_590;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_b28 + 0x28),"kDefaultValue",(allocator<char> *)(local_b28 + 0x27));
  local_b2a = 0;
  if ((local_1e1 & 1) == 0) {
    std::allocator<char>::allocator();
    local_b2a = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)local_b28,"nullptr",&local_b29);
  }
  else {
    absl::lts_20240722::AlphaNum::AlphaNum(&local_b60,"&");
    absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>
              (&local_b90,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_b28,&local_b60);
  }
  io::Printer::Sub::Sub<std::__cxx11::string>
            (&local_590,(string *)(local_b28 + 0x28),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b28);
  local_930 = &local_4d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_bb0,"lazy_var",&local_bb1);
  io::Printer::Sub::Sub<std::__cxx11::string&>
            (&local_4d8,&local_bb0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100);
  local_930 = &local_420;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_cb8 + 0x28),"lazy_args",(allocator<char> *)(local_cb8 + 0x27));
  local_d1a = 0;
  if ((local_1e1 & 1) == 0) {
    absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>
              (&local_ce8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100);
    absl::lts_20240722::AlphaNum::AlphaNum(&local_d18,",");
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_cb8,&local_ce8);
  }
  else {
    std::allocator<char>::allocator();
    local_d1a = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)local_cb8,"",&local_d19);
  }
  io::Printer::Sub::Sub<std::__cxx11::string>
            (&local_c70,(string *)(local_cb8 + 0x28),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_cb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d40,",",&local_d41);
  io::Printer::Sub::WithSuffix(&local_420,&local_c70,&local_d40);
  local_930 = &local_368;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d68,"byte",&local_d69);
  if ((local_1e2 & 1) == 0) {
    local_e98 = (char (*) [5])0x5c0ec6;
  }
  else {
    local_e98 = (char (*) [5])0x5c0ec1;
  }
  io::Printer::Sub::Sub<char_const(&)[5]>(&local_368,&local_d68,local_e98);
  local_930 = &local_2b0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d90,"Set",&local_d91);
  local_da0 = "Set";
  if ((local_1e2 & 1) != 0) {
    local_da0 = "SetBytes";
  }
  io::Printer::Sub::Sub<char_const*>(&local_2b0,&local_d90,&local_da0);
  local_da1 = 0;
  local_1f8 = &local_928;
  local_1f0 = 10;
  std::allocator<google::protobuf::io::Printer::Sub>::allocator(&local_da2);
  __l._M_len = local_1f0;
  __l._M_array = local_1f8;
  std::
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>::
  vector(__return_storage_ptr__,__l,&local_da2);
  std::allocator<google::protobuf::io::Printer::Sub>::~allocator(&local_da2);
  local_eb8 = (Sub *)&local_1f8;
  do {
    local_eb8 = local_eb8 + -1;
    io::Printer::Sub::~Sub(local_eb8);
  } while (local_eb8 != &local_928);
  std::__cxx11::string::~string((string *)&local_d90);
  std::allocator<char>::~allocator(&local_d91);
  std::__cxx11::string::~string((string *)&local_d68);
  std::allocator<char>::~allocator(&local_d69);
  std::__cxx11::string::~string((string *)&local_d40);
  std::allocator<char>::~allocator(&local_d41);
  io::Printer::Sub::~Sub(&local_c70);
  std::__cxx11::string::~string((string *)local_cb8);
  if ((local_d1a & 1) != 0) {
    std::allocator<char>::~allocator(&local_d19);
  }
  std::__cxx11::string::~string((string *)(local_cb8 + 0x28));
  std::allocator<char>::~allocator((allocator<char> *)(local_cb8 + 0x27));
  std::__cxx11::string::~string((string *)&local_bb0);
  std::allocator<char>::~allocator(&local_bb1);
  std::__cxx11::string::~string((string *)local_b28);
  if ((local_b2a & 1) != 0) {
    std::allocator<char>::~allocator(&local_b29);
  }
  std::__cxx11::string::~string((string *)(local_b28 + 0x28));
  std::allocator<char>::~allocator((allocator<char> *)(local_b28 + 0x27));
  std::__cxx11::string::~string((string *)local_a80);
  std::__cxx11::string::~string((string *)(local_a80 + 0x28));
  std::allocator<char>::~allocator((allocator<char> *)(local_a80 + 0x27));
  std::__cxx11::string::~string((string *)&local_a38);
  std::__cxx11::string::~string((string *)&local_a10);
  std::allocator<char>::~allocator(&local_a11);
  std::__cxx11::string::~string((string *)&local_9f0);
  std::__cxx11::string::~string((string *)&local_9c8);
  std::allocator<char>::~allocator(&local_9c9);
  std::__cxx11::string::~string((string *)&local_998);
  std::allocator<char>::~allocator(&local_999);
  std::__cxx11::string::~string((string *)&local_978);
  std::__cxx11::string::~string((string *)&local_950);
  std::allocator<char>::~allocator(&local_951);
  std::__cxx11::string::~string((string *)local_100);
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Sub> Vars(const FieldDescriptor* field, const Options& options) {
  bool cold = ShouldSplit(field, options);
  return {
      {"Type", PrimitiveTypeName(options, field->cpp_type())},
      {"kDefault", DefaultValue(options, field)},
      {"_field_cached_byte_size_", MakeVarintCachedSizeFieldName(field, cold)},
  };
}